

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O3

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::append_entries_ext
          (raft_server *this,
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *logs,req_ext_params *ext_params)

{
  buffer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<nuraft::buffer> *__args_1;
  undefined8 this_02;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this_03;
  ptr<cmd_result<ptr<buffer>_>_> pVar5;
  ptr<buffer> result;
  ptr<req_msg> req;
  log_val_type local_7e;
  undefined1 local_7d;
  int local_7c;
  shared_ptr<nuraft::buffer> local_78;
  _Any_data local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *local_40;
  raft_server *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  if (*(long *)((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8) ==
      *(long *)&(ext_params->after_precommit_).super__Function_base._M_functor) {
    local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar1 = logs[0x21].
             super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar1 != (pointer)0x0) {
      iVar2 = (**(code **)((psVar1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + 0x38))();
      if (3 < iVar2) {
        psVar1 = logs[0x21].
                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        msg_if_given_abi_cxx11_((string *)&local_68,"return null as log size is zero\n");
        (**(code **)((psVar1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    + 0x40))
                  (psVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"append_entries_ext",0x5d,&local_68);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_unused._0_8_ != &local_58) {
          operator_delete(local_68._M_unused._M_object);
        }
      }
    }
    peVar3 = (element_type *)operator_new(0xe0);
    (peVar3->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar3->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_001cf3a0;
    this_03 = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              &(peVar3->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
               super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
              (this_03,&local_78,OK);
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    this->_vptr_raft_server = (_func_int **)this_03;
    _Var4._M_pi = extraout_RDX;
    this_02 = local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  }
  else {
    local_40 = logs;
    local_38 = this;
    local_68._8_8_ = operator_new(0x60);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001ceb88;
    local_68._M_unused._0_8_ = (undefined8)(local_68._8_8_ + 0x10);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x10))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x10))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x5;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x20))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_001cebd8;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x30))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x30))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x40))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x40))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x50))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._8_8_ + 0x50))->_M_weak_count = 0;
    __args_1 = *(shared_ptr<nuraft::buffer> **)
                &(ext_params->after_precommit_).super__Function_base._M_functor;
    if (__args_1 !=
        *(shared_ptr<nuraft::buffer> **)
         ((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8)) {
      do {
        this_00 = (__args_1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_01 = (__args_1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        buffer::pos(this_00,0);
        local_7c = 0;
        local_7e = app_log;
        local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>const&,nuraft::log_val_type>
                  (&local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(log_entry **)&local_78,(allocator<nuraft::log_entry> *)&local_7d,
                   &local_7c,__args_1,&local_7e);
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     *)(local_68._M_unused._M_function_pointer + 0x38),(value_type *)&local_78);
        if (local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        __args_1 = __args_1 + 1;
      } while (__args_1 !=
               *(shared_ptr<nuraft::buffer> **)
                ((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8));
    }
    this = local_38;
    pVar5 = send_msg_to_leader(local_38,(ptr<req_msg> *)local_40,(req_ext_params *)&local_68);
    _Var4 = pVar5.
            super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    this_02 = local_68._8_8_;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
    _Var4._M_pi = extraout_RDX_00;
  }
  pVar5.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  pVar5.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar5.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::append_entries_ext
                                 ( const std::vector< ptr<buffer> >& logs,
                                   const req_ext_params& ext_params )
{
    if (logs.size() == 0) {
        ptr<buffer> result(nullptr);
        p_in("return null as log size is zero\n");
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::client_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 ) ;
    for (auto it = logs.begin(); it != logs.end(); ++it) {
        ptr<buffer> buf = *it;
        // Just in case when user forgot to reset the position.
        buf->pos(0);
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, *it, log_val_type::app_log ) );
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req, ext_params);
}